

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commissioner_impl.cpp
# Opt level: O1

void __thiscall
ot::commissioner::CommissionerImpl::HandleJoinerSessionTimer(CommissionerImpl *this,Timer *aTimer)

{
  long lVar1;
  char *pcVar2;
  char *pcVar3;
  iterator iVar4;
  ulong uVar5;
  ByteArray *aBytes;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  char *pcVar6;
  _Rb_tree<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::pair<std::vector<unsigned_char,std::allocator<unsigned_char>>const,ot::commissioner::JoinerSession>,std::_Select1st<std::pair<std::vector<unsigned_char,std::allocator<unsigned_char>>const,ot::commissioner::JoinerSession>>,std::less<std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::allocator<std::pair<std::vector<unsigned_char,std::allocator<unsigned_char>>const,ot::commissioner::JoinerSession>>>
  *this_00;
  _Self __tmp;
  iterator __position;
  bool bVar7;
  string_view fmt;
  format_args args;
  format_args args_00;
  undefined1 auVar8 [16];
  writer write;
  duration local_100;
  string local_f8;
  format_string_checker<char> local_d8;
  string local_a8;
  Timer *local_88;
  _Rb_tree<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::pair<std::vector<unsigned_char,std::allocator<unsigned_char>>const,ot::commissioner::JoinerSession>,std::_Select1st<std::pair<std::vector<unsigned_char,std::allocator<unsigned_char>>const,ot::commissioner::JoinerSession>>,std::less<std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::allocator<std::pair<std::vector<unsigned_char,std::allocator<unsigned_char>>const,ot::commissioner::JoinerSession>>>
  *local_80;
  ulong local_78;
  _Base_ptr local_70;
  long local_68;
  format_string_checker<char> *local_60 [3];
  undefined8 local_48;
  char *pcStack_40;
  
  local_68 = std::chrono::_V2::system_clock::now();
  local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"joiner-session","");
  local_d8.types_[0] = none_type;
  local_d8.context_.super_basic_format_parse_context<char>.format_str_.data_ =
       "joiner session timer triggered";
  local_d8.context_.super_basic_format_parse_context<char>.format_str_.size_ = 0x1e;
  local_d8.context_.super_basic_format_parse_context<char>.next_arg_id_ = 0;
  local_d8.context_.super_basic_format_parse_context<char>._20_4_ = 0;
  local_d8.parse_funcs_[0] = (parse_func)0x0;
  pcVar6 = "joiner session timer triggered";
  local_d8.context_.types_ = local_d8.types_;
  do {
    pcVar3 = pcVar6 + 1;
    if (*pcVar6 == '}') {
      if ((pcVar3 == "") || (*pcVar3 != '}')) {
        ::fmt::v10::detail::throw_format_error("unmatched \'}\' in format string");
      }
      pcVar3 = pcVar6 + 2;
    }
    else if (*pcVar6 == '{') {
      pcVar3 = ::fmt::v10::detail::
               parse_replacement_field<char,fmt::v10::detail::format_string_checker<char>&>
                         (pcVar6,"",&local_d8);
    }
    pcVar6 = pcVar3;
  } while (pcVar3 != "");
  args.field_1.args_ = in_R9.args_;
  args.desc_ = (unsigned_long_long)&local_d8;
  ::fmt::v10::vformat_abi_cxx11_
            (&local_a8,(v10 *)"joiner session timer triggered",(string_view)ZEXT816(0x1e),args);
  Log(kDebug,&local_f8,&local_a8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
    operator_delete(local_a8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
    operator_delete(local_f8._M_dataplus._M_p);
  }
  __position._M_node = (this->mJoinerSessions)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_70 = &(this->mJoinerSessions)._M_t._M_impl.super__Rb_tree_header._M_header;
  if (__position._M_node == local_70) {
    local_100.__r = 0;
    uVar5 = 0;
  }
  else {
    this_00 = (_Rb_tree<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::pair<std::vector<unsigned_char,std::allocator<unsigned_char>>const,ot::commissioner::JoinerSession>,std::_Select1st<std::pair<std::vector<unsigned_char,std::allocator<unsigned_char>>const,ot::commissioner::JoinerSession>>,std::less<std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::allocator<std::pair<std::vector<unsigned_char,std::allocator<unsigned_char>>const,ot::commissioner::JoinerSession>>>
               *)&this->mJoinerSessions;
    uVar5 = 0;
    local_100.__r = 0;
    local_88 = aTimer;
    local_80 = this_00;
    do {
      lVar1 = *(long *)(__position._M_node + 0x19);
      if (local_68 < lVar1) {
        if (lVar1 < local_100.__r) {
          local_100.__r = lVar1;
        }
        if ((uVar5 & 1) == 0) {
          local_100.__r = lVar1;
        }
        auVar8 = std::_Rb_tree_increment(__position._M_node);
        iVar4._M_node = auVar8._0_8_;
        uVar5 = CONCAT71(auVar8._9_7_,1);
      }
      else {
        local_78 = uVar5;
        iVar4 = std::
                _Rb_tree<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::pair<std::vector<unsigned_char,std::allocator<unsigned_char>>const,ot::commissioner::JoinerSession>,std::_Select1st<std::pair<std::vector<unsigned_char,std::allocator<unsigned_char>>const,ot::commissioner::JoinerSession>>,std::less<std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::allocator<std::pair<std::vector<unsigned_char,std::allocator<unsigned_char>>const,ot::commissioner::JoinerSession>>>
                ::erase_abi_cxx11_(this_00,__position);
        local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"joiner-session","");
        local_d8.types_[0] = string_type;
        pcVar6 = "joiner session (joiner ID={}) removed";
        local_d8.context_.super_basic_format_parse_context<char>.format_str_.data_ =
             "joiner session (joiner ID={}) removed";
        local_d8.context_.super_basic_format_parse_context<char>.format_str_.size_ = 0x25;
        local_d8.context_.super_basic_format_parse_context<char>.next_arg_id_ = 0;
        local_d8.context_.super_basic_format_parse_context<char>._20_4_ = 1;
        local_d8.context_.types_ = local_d8.types_;
        local_d8.parse_funcs_[0] =
             ::fmt::v10::detail::
             parse_format_specs<std::__cxx11::string,fmt::v10::detail::compile_parse_context<char>>;
        local_60[0] = (format_string_checker<char> *)local_d8.context_.types_;
        do {
          if (pcVar6 == "") break;
          pcVar3 = pcVar6;
          if (*pcVar6 == '{') {
LAB_001a9273:
            ::fmt::v10::detail::
            parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::writer::operator()((writer *)local_60,pcVar6,pcVar3);
            pcVar6 = ::fmt::v10::detail::
                     parse_replacement_field<char,fmt::v10::detail::format_string_checker<char,std::__cxx11::string>&>
                               (pcVar3,"",&local_d8);
            bVar7 = true;
          }
          else {
            pcVar3 = pcVar6 + 1;
            bVar7 = pcVar3 != "";
            if (bVar7) {
              if (*pcVar3 != '{') {
                pcVar2 = pcVar6 + 2;
                do {
                  pcVar3 = pcVar2;
                  bVar7 = pcVar3 != "";
                  if (pcVar3 == "") goto LAB_001a926f;
                  pcVar2 = pcVar3 + 1;
                } while (*pcVar3 != '{');
              }
              bVar7 = true;
            }
LAB_001a926f:
            if (bVar7) goto LAB_001a9273;
            ::fmt::v10::detail::
            parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::writer::operator()((writer *)local_60,pcVar6,"");
            bVar7 = false;
          }
        } while (bVar7);
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_60,
                   (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                   &__position._M_node[2]._M_left);
        utils::Hex_abi_cxx11_((string *)&local_d8,(utils *)local_60,aBytes);
        local_48 = CONCAT44(local_d8._4_4_,local_d8.types_[0]);
        pcStack_40 = local_d8.context_.super_basic_format_parse_context<char>.format_str_.data_;
        fmt.size_ = 0xd;
        fmt.data_ = (char *)0x25;
        args_00.field_1.args_ = in_R9.args_;
        args_00.desc_ = (unsigned_long_long)&local_48;
        ::fmt::v10::vformat_abi_cxx11_
                  (&local_a8,(v10 *)"joiner session (joiner ID={}) removed",fmt,args_00);
        Log(kInfo,&local_f8,&local_a8);
        this_00 = local_80;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
          operator_delete(local_a8._M_dataplus._M_p);
        }
        if ((size_t *)CONCAT44(local_d8._4_4_,local_d8.types_[0]) !=
            &local_d8.context_.super_basic_format_parse_context<char>.format_str_.size_) {
          operator_delete((undefined1 *)CONCAT44(local_d8._4_4_,local_d8.types_[0]));
        }
        if (local_60[0] != (format_string_checker<char> *)0x0) {
          operator_delete(local_60[0]);
        }
        uVar5 = local_78;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
          operator_delete(local_f8._M_dataplus._M_p);
          uVar5 = local_78;
        }
      }
      aTimer = local_88;
      __position._M_node = iVar4._M_node;
    } while (iVar4._M_node != local_70);
  }
  if ((uVar5 & 1) != 0) {
    Timer::Start(aTimer,(TimePoint)local_100.__r);
  }
  return;
}

Assistant:

void CommissionerImpl::HandleJoinerSessionTimer(Timer &aTimer)
{
    TimePoint nextShot;
    bool      hasNextShot = false;
    auto      now         = Clock::now();

    LOG_DEBUG(LOG_REGION_JOINER_SESSION, "joiner session timer triggered");

    auto it = mJoinerSessions.begin();
    while (it != mJoinerSessions.end())
    {
        auto &session = it->second;

        if (now >= session.GetExpirationTime())
        {
            it = mJoinerSessions.erase(it);

            LOG_INFO(LOG_REGION_JOINER_SESSION, "joiner session (joiner ID={}) removed",
                     utils::Hex(session.GetJoinerId()));
        }
        else
        {
            if (!hasNextShot || session.GetExpirationTime() < nextShot)
            {
                nextShot = session.GetExpirationTime();
            }
            hasNextShot = true;

            it++;
        }
    }

    if (hasNextShot)
    {
        aTimer.Start(nextShot);
    }
}